

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

void __thiscall
chrono::ChLoad<chrono::ChLoaderGravity>::ChLoad
          (ChLoad<chrono::ChLoaderGravity> *this,shared_ptr<chrono::ChLoadableUVW> *mloadable)

{
  __shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  chrono::ChLoadBase::ChLoadBase(&this->super_ChLoadBase);
  *(undefined ***)this = &PTR__ChLoad_00145ef8;
  std::__shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &mloadable->super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>);
  ChLoaderGravity::ChLoaderGravity(&this->loader,(shared_ptr<chrono::ChLoadableUVW> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

ChLoad(std::shared_ptr<typename Tloader::type_loadable> mloadable) : loader(mloadable) {}